

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.h
# Opt level: O2

void __thiscall
slang::ast::ASTContext::ASTContext
          (ASTContext *this,Scope *scope,LookupLocation lookupLocation,
          bitmask<slang::ast::ASTFlags> flags)

{
  Scope *local_30;
  
  local_30 = scope;
  not_null<slang::ast::Scope_const*>::not_null<slang::ast::Scope_const*,void>
            ((not_null<slang::ast::Scope_const*> *)this,&local_30);
  this->lookupIndex = lookupLocation.index;
  (this->flags).m_bits = flags.m_bits;
  this->instanceOrProc = (Symbol *)0x0;
  this->firstTempVar = (TempVarSymbol *)0x0;
  this->randomizeDetails = (RandomizeDetails *)0x0;
  this->assertionInstance = (AssertionInstanceDetails *)0x0;
  if (lookupLocation.scope == scope || lookupLocation.scope == (Scope *)0x0) {
    return;
  }
  assert::assertFailed
            ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
             ,0x119,
             "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)")
  ;
}

Assistant:

ASTContext(const Scope& scope, LookupLocation lookupLocation,
               bitmask<ASTFlags> flags = ASTFlags::None) :
        scope(&scope),
        lookupIndex(lookupLocation.getIndex()), flags(flags) {
        ASSERT(!lookupLocation.getScope() || lookupLocation.getScope() == &scope);
    }